

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_layout_helper.cc
# Opt level: O1

array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>
* google::protobuf::compiler::cpp::MessageLayoutHelper::ConsolidateAlignedFieldGroups
            (array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>
             *__return_storage_ptr__,
            array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>
            *field_groups,size_t alignment,size_t target_alignment)

{
  ulong uVar1;
  __normal_iterator<google::protobuf::compiler::cpp::FieldGroup_*,_std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>_>
  __seed;
  FieldGroup *pFVar2;
  long lVar3;
  Nonnull<const_char_*> pcVar4;
  undefined8 extraout_RAX;
  size_t j;
  ulong uVar5;
  long *plVar6;
  long lVar7;
  FieldGroup field_group;
  FieldGroup local_68;
  ulong local_48;
  array<std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>,_6UL>
  *local_40;
  size_type local_38;
  
  local_40 = field_groups;
  if (alignment < target_alignment) {
    pcVar4 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                       (target_alignment,alignment,"target_alignment > alignment");
  }
  if (pcVar4 == (Nonnull<const_char_*>)0x0) {
    pcVar4 = (Nonnull<const_char_*>)0x0;
    local_48 = target_alignment / alignment;
    if (target_alignment % alignment != 0) {
      pcVar4 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                         (target_alignment % alignment,0,"target_alignment % alignment == size_t{0}"
                         );
    }
    if (pcVar4 == (Nonnull<const_char_*>)0x0) {
      lVar7 = 0;
      memset(__return_storage_ptr__,0,0x90);
      local_38 = (local_48 + 5) / local_48;
      do {
        std::
        vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
        ::reserve((vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
                   *)(&__return_storage_ptr__->field_0x0 + lVar7 * 0x18),local_38);
        plVar6 = (long *)(&local_40->field_0x0 + lVar7 * 0x18);
        __seed._M_current = (FieldGroup *)*plVar6;
        pFVar2 = (FieldGroup *)plVar6[1];
        if (__seed._M_current != pFVar2) {
          lVar3 = (long)pFVar2 - (long)__seed._M_current >> 5;
          std::
          _Temporary_buffer<__gnu_cxx::__normal_iterator<google::protobuf::compiler::cpp::FieldGroup_*,_std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>_>,_google::protobuf::compiler::cpp::FieldGroup>
          ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<google::protobuf::compiler::cpp::FieldGroup_*,_std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>_>,_google::protobuf::compiler::cpp::FieldGroup>
                               *)&local_68,__seed,(lVar3 - (lVar3 + 1 >> 0x3f)) + 1 >> 1);
          if (local_68.fields_.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
            std::
            __inplace_stable_sort<__gnu_cxx::__normal_iterator<google::protobuf::compiler::cpp::FieldGroup*,std::vector<google::protobuf::compiler::cpp::FieldGroup,std::allocator<google::protobuf::compiler::cpp::FieldGroup>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (__seed._M_current,pFVar2);
          }
          else {
            std::
            __stable_sort_adaptive<__gnu_cxx::__normal_iterator<google::protobuf::compiler::cpp::FieldGroup*,std::vector<google::protobuf::compiler::cpp::FieldGroup,std::allocator<google::protobuf::compiler::cpp::FieldGroup>>>,google::protobuf::compiler::cpp::FieldGroup*,long,__gnu_cxx::__ops::_Iter_less_iter>
                      (__seed._M_current,pFVar2,
                       local_68.fields_.
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       local_68.fields_.
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
          }
          std::
          _Temporary_buffer<__gnu_cxx::__normal_iterator<google::protobuf::compiler::cpp::FieldGroup_*,_std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>_>,_google::protobuf::compiler::cpp::FieldGroup>
          ::~_Temporary_buffer
                    ((_Temporary_buffer<__gnu_cxx::__normal_iterator<google::protobuf::compiler::cpp::FieldGroup_*,_std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>_>,_google::protobuf::compiler::cpp::FieldGroup>
                      *)&local_68);
        }
        if (plVar6[1] != *plVar6) {
          uVar5 = 0;
          do {
            local_68.fields_.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_68.preferred_location_ = 0.0;
            local_68.estimated_memory_size_ = 0;
            local_68.fields_.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_68.fields_.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            uVar1 = uVar5 + local_48;
            for (; (uVar5 < uVar1 && (uVar5 < (ulong)(plVar6[1] - *plVar6 >> 5))); uVar5 = uVar5 + 1
                ) {
              FieldGroup::UpdatePreferredLocationAndInsertOtherFields
                        (&local_68,(FieldGroup *)(uVar5 * 0x20 + *plVar6));
            }
            std::
            vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
            ::push_back((vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
                         *)(&__return_storage_ptr__->field_0x0 + lVar7 * 0x18),&local_68);
            if (local_68.fields_.
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_68.fields_.
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_68.fields_.
                                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_68.fields_.
                                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            uVar5 = uVar1;
          } while (uVar1 < (ulong)(plVar6[1] - *plVar6 >> 5));
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 6);
      return __return_storage_ptr__;
    }
  }
  else {
    ConsolidateAlignedFieldGroups();
  }
  ConsolidateAlignedFieldGroups();
  std::
  _Temporary_buffer<__gnu_cxx::__normal_iterator<google::protobuf::compiler::cpp::FieldGroup_*,_std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>_>,_google::protobuf::compiler::cpp::FieldGroup>
  ::~_Temporary_buffer
            ((_Temporary_buffer<__gnu_cxx::__normal_iterator<google::protobuf::compiler::cpp::FieldGroup_*,_std::vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>_>,_google::protobuf::compiler::cpp::FieldGroup>
              *)&local_68);
  lVar7 = 0x78;
  do {
    std::
    vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
    ::~vector((vector<google::protobuf::compiler::cpp::FieldGroup,_std::allocator<google::protobuf::compiler::cpp::FieldGroup>_>
               *)(&__return_storage_ptr__->field_0x0 + lVar7));
    lVar7 = lVar7 + -0x18;
  } while (lVar7 != -0x18);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

std::array<std::vector<FieldGroup>, MessageLayoutHelper::kMaxHotness>
MessageLayoutHelper::ConsolidateAlignedFieldGroups(
    std::array<std::vector<FieldGroup>, kMaxHotness>& field_groups,
    size_t alignment, size_t target_alignment) {
  ABSL_CHECK_GT(target_alignment, alignment);
  ABSL_CHECK_EQ(target_alignment % alignment, size_t{0});

  const size_t size_inflation = target_alignment / alignment;
  std::array<std::vector<FieldGroup>, kMaxHotness> partitions_aligned_to_target;

  for (size_t h = 0; h < kMaxHotness; ++h) {
    auto& partition = field_groups[h];
    auto& target_partition = partitions_aligned_to_target[h];
    target_partition.reserve((field_groups.size() + size_inflation - 1) /
                             size_inflation);

    // Using stable_sort ensures that the output is consistent across runs.
    std::stable_sort(partition.begin(), partition.end());

    // Group fields into groups of `size_inflation` fields, which will be
    // aligned to `target_alignment`.
    for (size_t i = 0; i < partition.size(); i += size_inflation) {
      FieldGroup field_group;
      for (size_t j = i; j < partition.size() && j < i + size_inflation; ++j) {
        field_group.Append(partition[j]);
      }
      target_partition.push_back(field_group);
    }
  }

  return partitions_aligned_to_target;
}